

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O3

bool __thiscall QFileDevice::setPermissions(QFileDevice *this,Permissions permissions)

{
  QObjectData *pQVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  iVar3 = (*pQVar1->_vptr_QObjectData[7])(pQVar1);
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xb8))
                    ((long *)CONCAT44(extraout_var,iVar3));
  if (cVar2 == '\0') {
    QAbstractFileEngine::errorString
              (&local_38,(QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus);
    *(undefined4 *)((long)&pQVar1[5].q_ptr + 4) = 0xd;
    QString::operator=((QString *)&pQVar1[4].children.d.size,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    QFileDevicePrivate::setError
              ((QFileDevicePrivate *)(this->super_QIODevice).super_QObject.d_ptr.d,NoError);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDevice::setPermissions(Permissions permissions)
{
    Q_D(QFileDevice);
    if (d->engine()->setPermissions(permissions.toInt())) {
        unsetError();
        return true;
    }
    d->setError(QFile::PermissionsError, d->fileEngine->errorString());
    return false;
}